

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QImage>::moveAppend(QGenericArrayOps<QImage> *this,QImage *b,QImage *e)

{
  qsizetype *pqVar1;
  QImage *pQVar2;
  QImageData *pQVar3;
  QImage *this_00;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QImage>).ptr;
    do {
      this_00 = pQVar2 + (this->super_QArrayDataPointer<QImage>).size;
      QPaintDevice::QPaintDevice(&this_00->super_QPaintDevice);
      (this_00->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QImage_007e2f38;
      pQVar3 = b->d;
      b->d = (QImageData *)0x0;
      this_00->d = pQVar3;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QImage>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }